

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnBrTableTarget(SharedValidator *this,Location *loc,Var *depth)

{
  size_t sVar1;
  Result rhs;
  char *pcVar2;
  Var *depth_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  pcVar2 = (char *)0x0;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  (this->expr_loc_).filename._M_len = (loc->filename)._M_len;
  (this->expr_loc_).filename._M_str = (loc->filename)._M_str;
  sVar1 = (loc->field_1).field_1.offset;
  (this->expr_loc_).field_1.field_1.offset = sVar1;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = *(undefined8 *)((long)&loc->field_1 + 8);
  pcVar2 = Var::index(depth,pcVar2,(int)sVar1);
  rhs = TypeChecker::OnBrTableTarget(&this->typechecker_,(Index)pcVar2);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnBrTableTarget(const Location& loc, Var depth) {
  Result result = Result::Ok;
  expr_loc_ = loc;
  result |= typechecker_.OnBrTableTarget(depth.index());
  return result;
}